

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

bool __thiscall PowerPos<0,_0,_0>::propagate(PowerPos<0,_0,_0> *this)

{
  bool bVar1;
  PowerPos<0,_0,_0> *in_stack_00000028;
  PowerPos<0,_0,_0> *in_stack_00000048;
  PowerPos<0,_0,_0> *in_stack_00000068;
  PowerPos<0,_0,_0> *in_stack_00000078;
  PowerPos<0,_0,_0> *in_stack_00000088;
  undefined1 local_1;
  
  bVar1 = propagate_case_zero(in_stack_00000028);
  if (bVar1) {
    bVar1 = propagate_case_one(in_stack_00000068);
    if (bVar1) {
      bVar1 = propagate_z(in_stack_00000048);
      if (bVar1) {
        bVar1 = propagate_x(in_stack_00000088);
        if (bVar1) {
          bVar1 = propagate_y(in_stack_00000078);
          if (bVar1) {
            local_1 = true;
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool propagate() override {
		// Check for case 0
		if (!propagate_case_zero()) {
			return false;
		}
		// Check for case 1
		if (!propagate_case_one()) {
			return false;
		}
		// Propagation on z
		if (!propagate_z()) {
			return false;
		}
		// Propagation on x
		if (!propagate_x()) {
			return false;
		}
		// Propagation on y
		if (!propagate_y()) {
			return false;
		}

		return true;
	}